

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O0

void eltcalc::GetEventRates<occurrence>(occurrence *occ,FILE *fin)

{
  mapped_type *pmVar1;
  double dVar2;
  size_t local_28;
  size_t i;
  int no_of_periods;
  int max_period_no;
  FILE *fin_local;
  occurrence *occ_local;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  _no_of_periods = (FILE *)fin;
  fin_local = (FILE *)occ;
  fread(&i,4,1,(FILE *)fin);
  local_28 = fread(fin_local,0xc,1,_no_of_periods);
  while (local_28 != 0) {
    dVar2 = (double)(int)i;
    pmVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)event_rate_,(key_type *)fin_local);
    *pmVar1 = 1.0 / dVar2 + *pmVar1;
    if (i._4_4_ < *(int *)(fin_local + 4)) {
      i._4_4_ = *(int *)(fin_local + 4);
    }
    local_28 = fread(fin_local,0xc,1,_no_of_periods);
  }
  fclose(_no_of_periods);
  if ((int)i < i._4_4_) {
    fprintf(_stderr,"FATAL: Maximum period number in occurrence file exceeds that in header.\n");
    exit(1);
  }
  return;
}

Assistant:

void GetEventRates(T &occ, FILE * fin)
	{
		// Calculate event rates from occurrence file
		int max_period_no = 0;
		int no_of_periods = 0;
		size_t i = fread(&no_of_periods, sizeof(no_of_periods), 1, fin);
		i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			event_rate_[occ.event_id] += 1 / (double)no_of_periods;
			if (max_period_no < occ.period_no)
				max_period_no = occ.period_no;
			i = fread(&occ, sizeof(occ), 1, fin);
		}
		fclose(fin);

		if (max_period_no > no_of_periods) {
			fprintf(stderr, "FATAL: Maximum period number in occurrence file exceeds that in header.\n");
			exit(EXIT_FAILURE);
		}
	}